

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
PrimitiveDictionary(PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
                    *this,Allocator *allocator_p,idx_t maximum_size_p,
                   idx_t maximum_target_capacity_p)

{
  ulong uVar1;
  idx_t iVar2;
  uint32_t *puVar3;
  ulong uVar4;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  iVar2 = duckdb::NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = iVar2;
  this->capacity_mask = iVar2 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  Allocator::Allocate((Allocator *)&this->allocated_dictionary,(idx_t)this->allocator);
  Allocator::Allocate((Allocator *)&this->allocated_target,(idx_t)this->allocator);
  duckdb::MemoryStream::MemoryStream
            (&this->target_stream,*(uchar **)&this->field_0x50,*(ulong *)&this->field_0x58);
  uVar1 = this->capacity;
  this->dictionary = *(primitive_dictionary_entry_t **)&this->field_0x38;
  this->full = false;
  puVar3 = &(*(primitive_dictionary_entry_t **)&this->field_0x38)->index;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    *puVar3 = 0xffffffff;
    puVar3 = puVar3 + 4;
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}